

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

void __thiscall
trun::TestResponseProxy::Fatal(TestResponseProxy *this,int line,char *file,string *message)

{
  pointer pcVar1;
  Config *pCVar2;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  gnilk::Log::Debug<char_const*,char_const*,int,char_const*>
            (this->pLogger,"%s:%d:\t\'%s\'",file,line,(message->_M_dataplus)._M_p);
  printf("*** FATAL ERROR: %s:%d\t\'%s\'\n",file,line,(message->_M_dataplus)._M_p);
  this->errorCount = this->errorCount + 1;
  if (this->testResult < kTestResult_ModuleFail) {
    this->testResult = kTestResult_ModuleFail;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,file,&local_61);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + message->_M_string_length);
  trun::AssertError::Add(&this->assertError,kAssert_Fatal,line,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pCVar2 = Config::Instance();
  if (pCVar2->testExecutionType != kThreadedWithExit) {
    return;
  }
  pthread_exit((void *)0x0);
}

Assistant:

void TestResponseProxy::Fatal(int line, const char *file, std::string message) {
    pLogger->Debug("%s:%d:\t'%s'", file, line, message.c_str());

    printf("*** FATAL ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_ModuleFail) {
        testResult = kTestResult_ModuleFail;
    }
    assertError.Add(AssertError::kAssert_Fatal, line, file, message);
    TerminateThreadIfNeeded();
}